

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Data_Query_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Data_Query_PDU *this)

{
  pointer puVar1;
  KString *pKVar2;
  ostream *poVar3;
  ulong uVar4;
  ushort uVar5;
  pointer puVar6;
  KStringStream ss;
  char local_3c9;
  KString *local_3c8;
  KString local_3c0;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  KString local_380;
  KString local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_340);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_330,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Data Query PDU-\n",0x11);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_380,&this->super_Simulation_Management_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Request ID:       ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nTime Interval:            \n",0x1c);
  DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(&local_3c0,&this->m_TimeInterval);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_3c9 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_3c9,1);
  if (local_3c0._M_string_length != 0) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      local_3c9 = local_3c0._M_dataplus._M_p[uVar4];
      if ((local_3c0._M_string_length - 1 == uVar4) || (local_3c9 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_3c9,1);
      }
      else {
        local_3c9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_3c9,1);
        local_3c9 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_3c9,1);
      }
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < local_3c0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nNumber Fixed Datum:         ",0x1d);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nNumber Variable Datum:      ",0x1d);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Fixed Datum ID\'s\n",0x11);
  puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->m_vFixedDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"\t",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Variable Datum ID\'s\n",0x14);
  puVar1 = (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pKVar2 = local_3c8;
  for (puVar6 = (this->m_vVariableDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; local_3c8 = pKVar2, puVar6 != puVar1;
      puVar6 = puVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"\t",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pKVar2 = local_3c8;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return pKVar2;
}

Assistant:

KString Data_Query_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data Query PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Request ID:       "             << m_ui32RequestID
       << "\nTime Interval:            \n" << IndentString( m_TimeInterval.GetAsString() )
       << "\nNumber Fixed Datum:         " << m_ui32NumFixedDatum
       << "\nNumber Variable Datum:      " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum ID's\n";
    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << "\t" << *citrFixed << "\n";
    }

    ss << "Variable Datum ID's\n";
    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << "\t" << *citrVar << "\n";
    }

    return ss.str();
}